

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.hpp
# Opt level: O3

void ImageT<unsigned_char,_1U>::checkResamplerStatus(Resampler *resampler,char *pFilter)

{
  int iVar1;
  runtime_error *prVar2;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
  in_R9;
  string_view fmt;
  format_args args;
  string sStack_48;
  char *local_28 [2];
  
  iVar1 = *(int *)(resampler + 0x68);
  if (iVar1 == 3) {
    prVar2 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar2,"Resampler::put_line scan buffer full.");
  }
  else {
    if (iVar1 == 2) {
      prVar2 = (runtime_error *)__cxa_allocate_exception(0x10);
      fmt.size_ = 0xc;
      fmt.data_ = (char *)0x12;
      args.field_1.args_ = in_R9.args_;
      args.desc_ = (unsigned_long_long)local_28;
      local_28[0] = pFilter;
      ::fmt::v10::vformat_abi_cxx11_(&sStack_48,(v10 *)"Unknown filter: {}",fmt,args);
      std::runtime_error::runtime_error(prVar2,(string *)&sStack_48);
      __cxa_throw(prVar2,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    if (iVar1 != 1) {
      return;
    }
    prVar2 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar2,"Resampler or Resampler::put_line out of memory.");
  }
  __cxa_throw(prVar2,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

float encode(const float intensity) const override {
        return saturate(powf(intensity, oeGamma_));
    }